

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O0

void test_compat_zip_3(void)

{
  archive_entry *paVar1;
  char *unaff_retaddr;
  wchar_t in_stack_00000008;
  undefined4 in_stack_0000000c;
  char *in_stack_00000010;
  void *in_stack_00000018;
  size_t s;
  char *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  char *in_stack_00000048;
  void *in_stack_00000050;
  char *in_stack_000003d0;
  archive *in_stack_ffffffffffffffb8;
  archive_entry *paVar2;
  void *extra;
  archive_entry **ppaVar3;
  char *pcVar4;
  archive *in_stack_ffffffffffffffc0;
  uint uVar6;
  archive *paVar5;
  char *in_stack_ffffffffffffffc8;
  longlong v1;
  undefined4 in_stack_ffffffffffffffd0;
  wchar_t in_stack_ffffffffffffffd4;
  archive *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  wchar_t line;
  archive_entry *in_stack_fffffffffffffff0;
  
  line = (wchar_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  extract_reference_file(in_stack_000003d0);
  paVar1 = (archive_entry *)archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb8);
  archive_read_support_filter_all(in_stack_ffffffffffffffb8);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      (longlong)paVar1,(char *)0x147116,in_stack_fffffffffffffff0);
  archive_read_support_format_all((archive *)paVar1);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      (longlong)paVar2,(char *)0x14714f,in_stack_fffffffffffffff0);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      (longlong)paVar2,(char *)0x147192,in_stack_fffffffffffffff0);
  archive_read_next_header(in_stack_ffffffffffffffc0,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      (longlong)paVar1,(char *)0x1471d0,in_stack_fffffffffffffff0);
  uVar6 = (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  archive_entry_pathname(paVar1);
  paVar5 = (archive *)((ulong)uVar6 << 0x20);
  assertion_equal_string
            ((char *)paVar2,line,(char *)in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,(char *)paVar5,unaff_retaddr,in_stack_00000008);
  archive_entry_size(in_stack_fffffffffffffff0);
  extra = (void *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar5,0,(char *)0x14724f,
                      in_stack_fffffffffffffff0);
  archive_entry_size_is_set(in_stack_fffffffffffffff0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffc8,(char *)paVar5,extra);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar5,0,(char *)0x1472b5,
                      in_stack_fffffffffffffff0);
  archive_read_next_header(paVar5,ppaVar3);
  paVar1 = paVar2;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar5,(longlong)paVar2,
                      (char *)0x1472f3,in_stack_fffffffffffffff0);
  archive_entry_pathname(paVar2);
  paVar2 = (archive_entry *)((ulong)paVar5 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar1,line,(char *)in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,(char *)paVar2,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar2,0,(char *)0x147377,
                      in_stack_fffffffffffffff0);
  archive_entry_size(in_stack_fffffffffffffff0);
  pcVar4 = (char *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar2,0,(char *)0x1473b2,
                      in_stack_fffffffffffffff0);
  archive_entry_size_is_set(in_stack_fffffffffffffff0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffc8,(char *)paVar2,pcVar4);
  archive_entry_set_pathname(paVar2,pcVar4);
  archive_read_extract
            (in_stack_ffffffffffffffd8,
             (archive_entry *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar2,(longlong)paVar1,
                      (char *)0x14742c,in_stack_fffffffffffffff0);
  pcVar4 = slurpfile((size_t *)&stack0xffffffffffffffd8,"test_3.txt");
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar2,0,(char *)0x147478,
                      in_stack_fffffffffffffff0);
  ppaVar3 = (archive_entry **)0xc;
  paVar5 = (archive *)0x2e6462;
  v1 = 0;
  assertion_equal_mem(p,s._4_4_,in_stack_00000018,in_stack_00000010,
                      (void *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                      (size_t)refname,in_stack_00000048,in_stack_00000050);
  free(pcVar4);
  archive_read_next_header(paVar5,ppaVar3);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,v1,(char *)paVar5,
                      (longlong)paVar1,(char *)0x14750c,in_stack_fffffffffffffff0);
  archive_read_close((archive *)0x147516);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,v1,(char *)paVar5,
                      (longlong)paVar1,(char *)0x147545,in_stack_fffffffffffffff0);
  archive_read_free((archive *)0x14754f);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,v1,(char *)paVar5,
                      (longlong)paVar1,(char *)0x14757e,in_stack_fffffffffffffff0);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_3)
{
	const char *refname = "test_compat_zip_3.zip";
	struct archive_entry *ae;
	struct archive *a;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 10240));

	/* First entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("soapui-4.0.0/", archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));

	/* Second entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("soapui-4.0.0/soapui-settings.xml", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(1030, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));

	/* Extract under a different name. */
	archive_entry_set_pathname(ae, "test_3.txt");
	if(libz_enabled) {
		char *p;
		size_t s;
		assertEqualIntA(a, ARCHIVE_OK, archive_read_extract(a, ae, 0));
		/* Verify the first 12 bytes actually got written to disk correctly. */
		p = slurpfile(&s, "test_3.txt");
		assertEqualInt(s, 1030);
		assertEqualMem(p, "<?xml versio", 12);
		free(p);
	} else {
		skipping("Skipping ZIP compression check, no libz support");
	}
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}